

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O0

void placalc::doit(float relativeSecondaryFactor,float absoluteFactor)

{
  bool bVar1;
  size_t sVar2;
  reference pvVar3;
  pointer ppVar4;
  int local_58;
  float local_54;
  gulSampleslevelRec gr;
  _Node_iterator_base<std::pair<const_event_amplification,_float>,_true> local_48;
  iterator iter;
  float factor;
  gulSampleslevelHeader gh;
  event_amplification ea;
  float defaultFactor;
  int sampleSize;
  int streamType;
  size_t i;
  float local_10;
  int gulstreamType;
  float absoluteFactor_local;
  float relativeSecondaryFactor_local;
  
  local_10 = absoluteFactor;
  gulstreamType = (int)relativeSecondaryFactor;
  LoadItemToAmplification();
  if ((local_10 == 0.0) && (!NAN(local_10))) {
    LoadPostLossAmplificationFactors((float)gulstreamType);
  }
  i._4_4_ = 0;
  fread((void *)((long)&i + 4),4,1,_stdin);
  defaultFactor = (float)(i._4_4_ & 0x1000000);
  if (defaultFactor == 0.0) {
    defaultFactor = (float)(i._4_4_ & 0x2000000);
  }
  if ((defaultFactor != 2.3509887e-38) && (defaultFactor != 9.403955e-38)) {
    fprintf(_stderr,"FATAL: placalc: %s: Not a valid gul stream type %d\n","doit",(ulong)i._4_4_);
    exit(1);
  }
  fwrite((void *)((long)&i + 4),4,1,_stdout);
  ea.amplification_id = 0;
  _sampleSize = fread(&ea.amplification_id,4,1,_stdin);
  if (_sampleSize == 0) {
    fprintf(_stderr,"FATAL: placalc: %s: Invalid sample size %d\n","doit",
            (ulong)(uint)ea.amplification_id);
  }
  fwrite(&ea.amplification_id,4,1,_stdout);
  ea.event_id = (int)local_10;
  if ((local_10 == 0.0) && (!NAN(local_10))) {
    ea.event_id = 0x3f800000;
  }
  do {
    if ((_sampleSize == 0) ||
       (sVar2 = fread((void *)((long)&iter.
                                      super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>
                                      ._M_cur + 4),8,1,_stdin), sVar2 == 0)) {
      return;
    }
    fwrite((void *)((long)&iter.
                           super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>
                           ._M_cur + 4),8,1,_stdout);
    gh.event_id = iter.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>.
                  _M_cur._4_4_;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)item_to_amplification_,
                        (long)(int)factor);
    gh.item_id = *pvVar3;
    iter.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>._M_cur._0_4_ =
         (float)ea.event_id;
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<event_amplification,_float,_placalc::hash_event_amplification,_std::equal_to<event_amplification>,_std::allocator<std::pair<const_event_amplification,_float>_>_>
         ::find((unordered_map<event_amplification,_float,_placalc::hash_event_amplification,_std::equal_to<event_amplification>,_std::allocator<std::pair<const_event_amplification,_float>_>_>
                 *)factors_,(key_type *)&gh);
    gr = (gulSampleslevelRec)
         std::
         unordered_map<event_amplification,_float,_placalc::hash_event_amplification,_std::equal_to<event_amplification>,_std::allocator<std::pair<const_event_amplification,_float>_>_>
         ::end((unordered_map<event_amplification,_float,_placalc::hash_event_amplification,_std::equal_to<event_amplification>,_std::allocator<std::pair<const_event_amplification,_float>_>_>
                *)factors_);
    bVar1 = std::__detail::operator!=
                      (&local_48,
                       (_Node_iterator_base<std::pair<const_event_amplification,_float>,_true> *)&gr
                      );
    if (bVar1) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_event_amplification,_float>,_false,_true>::operator->
                         ((_Node_iterator<std::pair<const_event_amplification,_float>,_false,_true>
                           *)&local_48);
      iter.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>._M_cur._0_4_
           = ppVar4->second;
    }
    do {
      _sampleSize = fread(&local_58,8,1,_stdin);
      if (_sampleSize == 0) break;
      local_54 = iter.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>.
                 _M_cur._0_4_ * local_54;
      fwrite(&local_58,8,1,_stdout);
    } while (local_58 != 0);
  } while( true );
}

Assistant:

void doit(const float relativeSecondaryFactor,
	    const float absoluteFactor) {

    LoadItemToAmplification();
    // Ignore loss factors file if absolute factor is specified
    if (absoluteFactor == 0.0) {
      LoadPostLossAmplificationFactors(relativeSecondaryFactor);
    }

    // Check input stream type is GUL item stream or loss stream and write type
    // to output
    int gulstreamType = 0;
    size_t i = fread(&gulstreamType, sizeof(gulstreamType), 1, stdin);
    int streamType = gulstreamType & gulstream_id;
    if (streamType == 0) {
      streamType = gulstreamType & loss_stream_id;
    }
    if (streamType != gulstream_id && streamType != loss_stream_id) {
      fprintf(stderr, "FATAL: placalc: %s: Not a valid gul stream type %d\n",
	      __func__, gulstreamType);
      exit(EXIT_FAILURE);
    }
    fwrite(&gulstreamType, sizeof(gulstreamType), 1, stdout);

    // Read in number of samples and write to output
    int sampleSize = 0;
    i = fread(&sampleSize, sizeof(sampleSize), 1, stdin);
    if (i == 0) {
      fprintf(stderr, "FATAL: placalc: %s: Invalid sample size %d\n", __func__,
	      sampleSize);
    }
    fwrite(&sampleSize, sizeof(sampleSize), 1, stdout);

    // Default factor is 1.0 or absolute factor given by user
    const float defaultFactor = (absoluteFactor == 0.0) ? 1.0 : absoluteFactor;

    // Read in data from GUL stream, apply Post Loss Amplification (PLA) factors
    // and write out to standard output
    while (i != 0) {
      event_amplification ea;
      gulSampleslevelHeader gh;
      i = fread(&gh, sizeof(gh), 1, stdin);
      if (i == 0) break;

      fwrite(&gh, sizeof(gh), 1, stdout);
      ea.event_id = gh.event_id;
      ea.amplification_id = item_to_amplification_[gh.item_id];
      // Default factor is used if post loss amplification factor is not present
      float factor = defaultFactor;
      auto iter = factors_.find(ea);
      if (iter != factors_.end()) factor = iter->second;

      gulSampleslevelRec gr;
      while ((i = fread(&gr, sizeof(gr), 1, stdin)) != 0) {
	gr.loss *= factor;
	fwrite(&gr, sizeof(gr), 1, stdout);
	if (gr.sidx == 0) break;
      }
    }

  }